

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgs.c
# Opt level: O3

void trn_lbfgs(mdl_t *mdl)

{
  undefined8 uVar1;
  undefined8 uVar2;
  opt_t *poVar3;
  char *pcVar4;
  size_t sVar5;
  grd_t *pgVar6;
  double *x;
  FILE *pFVar7;
  undefined1 *puVar8;
  _Bool _Var9;
  int iVar10;
  uint64_t f_1;
  double *pdVar11;
  double *pdVar12;
  FILE *pFVar13;
  uint64_t uVar14;
  double *pdVar15;
  undefined1 *puVar16;
  long lVar17;
  ulong uVar18;
  mdl_t *mdl_00;
  uint uVar19;
  double *pdVar20;
  ulong uVar21;
  uint64_t uVar22;
  uint uVar23;
  uint32_t uVar24;
  long lVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined8 uStack_140;
  undefined1 auStack_138 [32];
  uint64_t nftr;
  ulong local_110;
  undefined1 *local_108;
  size_t local_100;
  int local_f8;
  int local_f4;
  int type;
  int histsz;
  uint64_t f;
  uint local_dc;
  double *local_d8;
  grd_t *local_d0;
  double *local_c8;
  double *local_c0;
  double local_b8;
  double local_b0;
  double *local_a8;
  uint32_t local_9c;
  FILE *local_98;
  double local_90;
  mdl_t *local_88;
  undefined1 *local_80;
  long local_78;
  double local_70;
  ulong local_68;
  double local_60;
  uint64_t local_58;
  double *local_50;
  double *local_48;
  char local_39;
  ulong local_38;
  
  poVar3 = mdl->opt;
  uVar22 = mdl->nftr;
  local_9c = poVar3->maxiter;
  local_110 = (ulong)poVar3->objwin;
  uVar21 = (ulong)(poVar3->lbfgs).histsz;
  local_b8 = poVar3->rho1;
  auStack_138._16_8_ = uVar21 * 8 + 0xf & 0xfffffffffffffff0;
  local_80 = auStack_138 + -auStack_138._16_8_;
  lVar25 = (long)local_80 - auStack_138._16_8_;
  local_98 = (FILE *)(lVar25 - auStack_138._16_8_);
  puVar16 = (undefined1 *)((long)local_98 - (local_110 * 8 + 0xf & 0xfffffffffffffff0));
  local_48 = mdl->theta;
  local_108 = puVar16;
  local_88 = mdl;
  *(undefined8 *)(puVar16 + -8) = 0x10a906;
  pdVar11 = xvm_new(uVar22);
  *(undefined8 *)(puVar16 + -8) = 0x10a911;
  local_c8 = xvm_new(uVar22);
  *(undefined8 *)(puVar16 + -8) = 0x10a920;
  local_d8 = xvm_new(uVar22);
  *(undefined8 *)(puVar16 + -8) = 0x10a92f;
  local_50 = xvm_new(uVar22);
  if (uVar21 != 0) {
    uVar18 = 0;
    do {
      *(undefined8 *)(puVar16 + -8) = 0x10a948;
      pdVar12 = xvm_new(uVar22);
      *(double **)(local_80 + uVar18 * 8) = pdVar12;
      *(undefined8 *)(puVar16 + -8) = 0x10a958;
      pdVar12 = xvm_new(uVar22);
      *(double **)(lVar25 + uVar18 * 8) = pdVar12;
      uVar18 = uVar18 + 1;
    } while (uVar21 != uVar18);
  }
  local_38 = uVar21;
  if ((local_b8 != 0.0) || (NAN(local_b8))) {
    *(undefined8 *)(puVar16 + -8) = 0x10a994;
    local_a8 = xvm_new(uVar22);
  }
  else {
    local_a8 = (double *)0x0;
  }
  mdl_00 = local_88;
  pdVar12 = local_c8;
  *(undefined8 *)(puVar16 + -8) = 0x10a9ae;
  local_d0 = grd_new(mdl_00,pdVar12);
  pcVar4 = mdl_00->opt->rstate;
  local_c0 = pdVar11;
  local_78 = lVar25;
  local_58 = uVar22;
  if (pcVar4 != (char *)0x0) {
    *(undefined8 *)(puVar16 + -8) = 0x10a9e0;
    pFVar13 = fopen(pcVar4,"r");
    if (pFVar13 == (FILE *)0x0) {
      *(undefined8 *)(puVar16 + -8) = 0x10a9f6;
      fatal("failed to open input state file");
    }
    *(undefined8 *)(puVar16 + -8) = 0x10aa1c;
    iVar10 = __isoc99_fscanf(pFVar13,"#state#%d#%d#%lu\n",&stack0xffffffffffffff08,
                             &stack0xffffffffffffff0c,auStack_138 + 0x18);
    if (iVar10 != 3) {
      *(undefined8 *)(puVar16 + -8) = 0x10aa3a;
      fatal("0 %s","invalid state file");
    }
    if ((local_f8 != 0) || (local_f4 != (int)local_38)) {
      *(undefined8 *)(puVar16 + -8) = 0x10aa59;
      fatal("state is not compatible");
    }
    if (auStack_138._24_8_ != 0) {
      uVar21 = 0;
      do {
        *(undefined8 *)(puVar16 + -8) = 0x10aa90;
        iVar10 = __isoc99_fscanf(pFVar13,"%lu",&type);
        if (iVar10 != 1) {
          *(undefined8 *)(puVar16 + -8) = 0x10aaa6;
          fatal("1 %s","invalid state file");
        }
        pdVar11 = local_c0 + _type;
        pdVar12 = local_d8 + _type;
        *(undefined8 *)(puVar16 + -8) = 0x10aad4;
        iVar10 = __isoc99_fscanf(pFVar13,"%la %la",pdVar11,pdVar12);
        if (iVar10 != 2) {
          *(undefined8 *)(puVar16 + -8) = 0x10aaea;
          fatal("2 %s","invalid state file");
        }
        if ((int)local_38 != 0) {
          uVar18 = 0;
          do {
            lVar17 = _type * 8;
            lVar25 = *(long *)(local_80 + uVar18 * 8);
            *(undefined8 *)(puVar16 + -8) = 0x10ab12;
            iVar10 = __isoc99_fscanf(pFVar13,"%la",lVar17 + lVar25);
            if (iVar10 != 1) {
              *(undefined8 *)(puVar16 + -8) = 0x10ab28;
              fatal("3 %s","invalid state file");
            }
            lVar17 = _type * 8;
            lVar25 = *(long *)(local_78 + uVar18 * 8);
            *(undefined8 *)(puVar16 + -8) = 0x10ab48;
            iVar10 = __isoc99_fscanf(pFVar13,"%la",lVar17 + lVar25);
            if (iVar10 != 1) {
              *(undefined8 *)(puVar16 + -8) = 0x10ab5e;
              fatal("4 %s","invalid state file");
            }
            uVar18 = uVar18 + 1;
          } while (local_38 != uVar18);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (ulong)auStack_138._24_8_);
    }
    lVar25 = local_78;
    puVar8 = local_80;
    pFVar7 = local_98;
    if ((int)local_38 != 0) {
      uVar21 = 0;
      do {
        uVar22 = local_58;
        pdVar11 = *(double **)(lVar25 + uVar21 * 8);
        pdVar12 = *(double **)(puVar8 + uVar21 * 8);
        *(undefined8 *)(puVar16 + -8) = 0x10aba2;
        dVar27 = xvm_dot(pdVar11,pdVar12,uVar22);
        *(double *)(&pFVar7->_flags + uVar21 * 2) = 1.0 / dVar27;
        uVar21 = uVar21 + 1;
      } while (local_38 != uVar21);
    }
    *(undefined8 *)(puVar16 + -8) = 0x10abc8;
    fclose(pFVar13);
    mdl_00 = local_88;
  }
  uVar22 = local_58;
  pdVar11 = local_c0;
  pgVar6 = local_d0;
  *(undefined8 *)(puVar16 + -8) = 0x10abe3;
  local_b0 = grd_gradient(pgVar6);
  if (local_9c == 0 || uit_stop != false) {
LAB_0010b374:
    pcVar4 = mdl_00->opt->sstate;
    if (pcVar4 != (char *)0x0) {
      *(undefined8 *)(puVar16 + -8) = 0x10b390;
      pFVar13 = fopen(pcVar4,"w");
      uVar21 = local_38;
      if (pFVar13 == (FILE *)0x0) {
        *(undefined8 *)(puVar16 + -8) = 0x10b3a6;
        fatal("failed to open output state file");
      }
      *(undefined8 *)(puVar16 + -8) = 0x10b3be;
      fprintf(pFVar13,"#state#0#%u#%lu\n",uVar21,uVar22);
      uVar21 = local_38;
      if (uVar22 != 0) {
        uVar22 = 0;
        local_98 = pFVar13;
        do {
          *(undefined8 *)(puVar16 + -8) = 0x10b3f0;
          fprintf(pFVar13,"%lu",uVar22);
          dVar27 = local_c0[uVar22];
          dVar28 = local_d8[uVar22];
          *(undefined8 *)(puVar16 + -8) = 0x10b417;
          fprintf(pFVar13," %la %la",dVar27,dVar28);
          lVar25 = local_78;
          puVar8 = local_80;
          if ((int)uVar21 != 0) {
            uVar18 = 0;
            do {
              uVar1 = *(undefined8 *)(*(long *)(puVar8 + uVar18 * 8) + uVar22 * 8);
              uVar2 = *(undefined8 *)(*(long *)(lVar25 + uVar18 * 8) + uVar22 * 8);
              *(undefined8 *)(puVar16 + -8) = 0x10b451;
              fprintf(pFVar13," %la %la",uVar1,uVar2);
              uVar18 = uVar18 + 1;
              pFVar13 = local_98;
            } while (uVar21 != uVar18);
          }
          *(undefined8 *)(puVar16 + -8) = 0x10b473;
          fputc(10,pFVar13);
          uVar22 = uVar22 + 1;
        } while (uVar22 != local_58);
      }
      *(undefined8 *)(puVar16 + -8) = 0x10b48f;
      fclose(pFVar13);
      pdVar11 = local_c0;
    }
    *(undefined8 *)(puVar16 + -8) = 0x10b49e;
    xvm_free(pdVar11);
    pdVar11 = local_c8;
    *(undefined8 *)(puVar16 + -8) = 0x10b4aa;
    xvm_free(pdVar11);
    pdVar11 = local_d8;
    *(undefined8 *)(puVar16 + -8) = 0x10b4b6;
    xvm_free(pdVar11);
    pdVar11 = local_50;
    *(undefined8 *)(puVar16 + -8) = 0x10b4bf;
    xvm_free(pdVar11);
    uVar21 = local_38;
    lVar25 = local_78;
    puVar8 = local_80;
    if ((int)local_38 != 0) {
      uVar18 = 0;
      do {
        pdVar11 = *(double **)(puVar8 + uVar18 * 8);
        *(undefined8 *)(puVar16 + -8) = 0x10b4db;
        xvm_free(pdVar11);
        pdVar11 = *(double **)(lVar25 + uVar18 * 8);
        *(undefined8 *)(puVar16 + -8) = 0x10b4e4;
        xvm_free(pdVar11);
        uVar18 = uVar18 + 1;
      } while (uVar21 != uVar18);
    }
    pdVar11 = local_a8;
    if ((local_b8 != 0.0) || (NAN(local_b8))) {
      *(undefined8 *)(puVar16 + -8) = 0x10b50c;
      xvm_free(pdVar11);
    }
    pgVar6 = local_d0;
    *(undefined8 *)(puVar16 + -8) = 0x10b518;
    grd_free(pgVar6);
    return;
  }
  uVar23 = (uint)local_38;
  local_100 = uVar22 * 8;
  local_39 = uVar22 == 0 || local_b8 == 0.0;
  local_68 = 0;
  local_dc = uVar23;
  do {
    pdVar20 = local_50;
    uVar22 = local_58;
    pdVar12 = local_c8;
    nftr = (uint64_t)(uVar23 + 1);
    uVar23 = (uint)local_68;
    if ((uint)local_38 < (uint)local_68) {
      uVar23 = (uint)local_38;
    }
    if (((local_b8 != 0.0) || (pdVar15 = local_c8, NAN(local_b8))) &&
       (pdVar15 = local_a8, local_58 != 0)) {
      dVar27 = mdl_00->opt->rho1;
      uVar14 = 0;
      do {
        if (0.0 <= local_48[uVar14]) {
          dVar28 = local_c8[uVar14];
          if ((0.0 < local_48[uVar14]) || (dVar28 < -dVar27)) {
            dVar30 = dVar28 + dVar27;
          }
          else {
            dVar30 = 0.0;
            if (dVar27 < dVar28) {
              dVar30 = dVar28 - dVar27;
            }
          }
        }
        else {
          dVar30 = local_c8[uVar14] - dVar27;
        }
        local_a8[uVar14] = dVar30;
        uVar14 = uVar14 + 1;
      } while (local_58 != uVar14);
    }
    auStack_138._8_8_ = pdVar15;
    *(undefined8 *)(puVar16 + -8) = 0x10ad23;
    xvm_neg(pdVar20,pdVar15,uVar22);
    pdVar20 = local_50;
    uVar22 = local_58;
    if ((uint)local_68 != 0) {
      iVar10 = -uVar23;
      uVar19 = (uint)local_38;
      if ((uint)local_68 < (uint)local_38) {
        uVar19 = (uint)local_68;
      }
      local_90 = (double)CONCAT44(local_90._4_4_,uVar19);
      dVar27 = (double)((long)puVar16 - auStack_138._16_8_);
      pdVar11 = (double *)((ulong)(uVar23 - 1) * 8 + (long)dVar27);
      f = (uint64_t)puVar16;
      local_70 = dVar27;
      do {
        uVar21 = (ulong)(uint)((int)nftr + iVar10) % (local_38 & 0xffffffff);
        local_60 = *(double *)(&local_98->_flags + uVar21 * 2);
        pdVar12 = *(double **)(local_80 + uVar21 * 8);
        *(undefined8 *)((long)dVar27 + -8) = 0x10ada9;
        dVar28 = xvm_dot(pdVar12,pdVar20,uVar22);
        dVar28 = dVar28 * local_60;
        *pdVar11 = dVar28;
        pdVar12 = *(double **)(local_78 + uVar21 * 8);
        *(undefined8 *)((long)dVar27 + -8) = 0x10add2;
        xvm_axpy(pdVar20,-dVar28,pdVar12,pdVar20,uVar22);
        pdVar11 = pdVar11 + -1;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0);
      uVar21 = (local_68 & 0xffffffff) % (local_38 & 0xffffffff);
      pdVar11 = *(double **)(local_78 + uVar21 * 8);
      *(undefined8 *)((long)dVar27 + -8) = 0x10adfa;
      dVar28 = xvm_dot(pdVar11,pdVar11,uVar22);
      if (uVar22 != 0) {
        dVar30 = *(double *)(&local_98->_flags + uVar21 * 2);
        uVar14 = 0;
        do {
          pdVar20[uVar14] = pdVar20[uVar14] * (1.0 / (dVar28 * dVar30));
          uVar14 = uVar14 + 1;
        } while (uVar22 != uVar14);
      }
      local_90 = (double)((ulong)local_90 & 0xffffffff);
      dVar28 = 0.0;
      uVar23 = local_dc;
      do {
        uVar21 = (ulong)uVar23 % (local_38 & 0xffffffff);
        local_60 = *(double *)(&local_98->_flags + uVar21 * 2);
        pdVar11 = *(double **)(local_78 + uVar21 * 8);
        *(undefined8 *)((long)dVar27 + -8) = 0x10ae79;
        dVar29 = xvm_dot(pdVar11,pdVar20,uVar22);
        dVar29 = dVar29 * local_60;
        dVar30 = *(double *)((long)local_70 + (long)dVar28 * 8);
        pdVar11 = *(double **)(local_80 + uVar21 * 8);
        *(undefined8 *)((long)dVar27 + -8) = 0x10aea6;
        xvm_axpy(pdVar20,dVar30 - dVar29,pdVar11,pdVar20,uVar22);
        dVar28 = (double)((long)dVar28 + 1);
        uVar23 = uVar23 - 1;
        puVar16 = (undefined1 *)f;
        pdVar12 = local_c8;
        pdVar11 = local_c0;
      } while ((ulong)dVar28 < (ulong)local_90);
    }
    pdVar20 = local_48;
    uVar22 = local_58;
    sVar5 = local_100;
    if (local_39 == '\0') {
      uVar14 = 0;
      do {
        if (0.0 <= local_50[uVar14] * local_a8[uVar14]) {
          local_50[uVar14] = 0.0;
        }
        uVar14 = uVar14 + 1;
      } while (local_58 != uVar14);
    }
    *(undefined8 *)(puVar16 + -8) = 0x10af22;
    memcpy(pdVar11,pdVar20,sVar5);
    pdVar20 = local_d8;
    *(undefined8 *)(puVar16 + -8) = 0x10af34;
    memcpy(pdVar20,pdVar12,sVar5);
    pdVar20 = local_50;
    dVar27 = 1.0;
    bVar26 = (uint)local_68 == 0;
    if (bVar26) {
      *(undefined8 *)(puVar16 + -8) = 0x10af54;
      dVar27 = xvm_norm(pdVar20,uVar22);
      dVar27 = 1.0 / dVar27;
    }
    pdVar20 = local_50;
    local_90 = 0.0;
    if ((local_b8 == 0.0) && (!NAN(local_b8))) {
      local_60 = dVar27;
      *(undefined8 *)(puVar16 + -8) = 0x10af94;
      local_90 = xvm_dot(pdVar12,pdVar20,uVar22);
      dVar27 = local_60;
    }
    mdl_00 = local_88;
    dVar28 = local_b0;
    if (uit_stop == false) {
      dVar30 = *(double *)(&DAT_00112270 + (ulong)bVar26 * 8);
      f = (uint64_t)(local_90 * 0.9);
      uVar24 = 1;
      pdVar20 = local_50;
      do {
        pdVar15 = local_48;
        local_70 = dVar30;
        local_60 = dVar27;
        *(undefined8 *)(puVar16 + -8) = 0x10b00d;
        xvm_axpy(pdVar15,dVar27,pdVar20,pdVar11,uVar22);
        pgVar6 = local_d0;
        if ((local_b8 != 0.0) || (NAN(local_b8))) {
          if (uVar22 == 0) {
            *(undefined8 *)(puVar16 + -8) = 0x10b14d;
            dVar28 = grd_gradient(pgVar6);
            dVar27 = 0.0;
          }
          else {
            uVar14 = 0;
            do {
              dVar27 = pdVar11[uVar14];
              if ((dVar27 == 0.0) && (!NAN(dVar27))) {
                dVar27 = -local_a8[uVar14];
              }
              if (dVar27 * local_48[uVar14] <= 0.0) {
                local_48[uVar14] = 0.0;
              }
              uVar14 = uVar14 + 1;
            } while (uVar22 != uVar14);
            *(undefined8 *)(puVar16 + -8) = 0x10b0cd;
            dVar28 = grd_gradient(pgVar6);
            dVar27 = 0.0;
            uVar14 = 0;
            do {
              dVar27 = dVar27 + (local_48[uVar14] - pdVar11[uVar14]) * local_50[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar22 != uVar14);
          }
          pdVar20 = local_50;
          dVar30 = local_70;
          if (dVar28 < dVar27 * 0.0001 + local_b0) break;
        }
        else {
          *(undefined8 *)(puVar16 + -8) = 0x10b02d;
          dVar28 = grd_gradient(pgVar6);
          pdVar20 = local_50;
          if (dVar28 <= local_90 * local_60 * 0.0001 + local_b0) {
            local_70 = dVar28;
            *(undefined8 *)(puVar16 + -8) = 0x10b114;
            dVar27 = xvm_dot(pdVar12,pdVar20,uVar22);
            mdl_00 = local_88;
            dVar30 = 2.1;
            dVar28 = local_70;
            if ((double)f <= dVar27) break;
          }
          else {
            dVar30 = 0.5;
          }
        }
        if (uVar24 == (mdl_00->opt->lbfgs).maxls) {
          *(undefined8 *)(puVar16 + -8) = 0x10b361;
          warning("maximum linesearch reached");
          goto LAB_0010b365;
        }
        uVar24 = uVar24 + 1;
        dVar27 = local_60 * dVar30;
      } while (uit_stop == false);
    }
    local_b0 = dVar28;
    dVar27 = local_b0;
    if ((uit_stop & 1U) != 0) {
LAB_0010b365:
      pdVar12 = local_48;
      sVar5 = local_100;
      *(undefined8 *)(puVar16 + -8) = 0x10b374;
      memcpy(pdVar12,pdVar11,sVar5);
      goto LAB_0010b374;
    }
    uVar24 = (int)local_68 + 1;
    *(undefined8 *)(puVar16 + -8) = 0x10b1d8;
    _Var9 = uit_progress(mdl_00,uVar24,dVar27);
    pdVar12 = local_48;
    uVar14 = local_58;
    if (!_Var9) goto LAB_0010b374;
    uVar21 = (ulong)uVar24 % (local_38 & 0xffffffff);
    local_60 = (double)CONCAT44(local_60._4_4_,uVar24);
    pdVar20 = *(double **)(local_80 + uVar21 * 8);
    *(undefined8 *)(puVar16 + -8) = 0x10b20d;
    xvm_sub(pdVar20,pdVar12,pdVar11,uVar14);
    uVar22 = local_58;
    x = local_c8;
    pdVar11 = local_d8;
    pdVar15 = *(double **)(local_78 + uVar21 * 8);
    *(undefined8 *)(puVar16 + -8) = 0x10b22f;
    xvm_sub(pdVar15,x,pdVar11,uVar22);
    uVar22 = local_58;
    pdVar11 = local_c0;
    *(undefined8 *)(puVar16 + -8) = 0x10b248;
    dVar28 = xvm_dot(pdVar15,pdVar20,uVar22);
    dVar27 = local_60;
    mdl_00 = local_88;
    *(double *)(&local_98->_flags + uVar21 * 2) = 1.0 / dVar28;
    uVar19 = local_60._0_4_;
    *(undefined8 *)(puVar16 + -8) = 0x10b274;
    local_70 = xvm_norm(pdVar12,uVar22);
    uVar1 = auStack_138._8_8_;
    *(undefined8 *)(puVar16 + -8) = 0x10b288;
    dVar30 = xvm_norm((double *)uVar1,uVar22);
    dVar28 = 1.0;
    if (1.0 <= local_70) {
      dVar28 = local_70;
    }
    if ((((dVar30 / dVar28 <= 1e-05) || (uVar19 == local_9c)) ||
        ((*(double *)(local_108 + ((local_68 & 0xffffffff) % (local_110 & 0xffffffff)) * 8) =
               local_b0, (uint)local_110 <= (uint)local_68 &&
         (ABS(*(double *)(local_108 + (((ulong)dVar27 & 0xffffffff) % (local_110 & 0xffffffff)) * 8)
              - local_b0) /
          *(double *)(local_108 + (((ulong)dVar27 & 0xffffffff) % (local_110 & 0xffffffff)) * 8) <
          mdl_00->opt->stopeps)))) || (uit_stop != false)) goto LAB_0010b374;
    uVar23 = (uint)nftr;
    local_dc = local_dc + 1;
    local_68 = (ulong)dVar27 & 0xffffffff;
    if (local_9c <= uVar19) goto LAB_0010b374;
  } while( true );
}

Assistant:

void trn_lbfgs(mdl_t *mdl) {
	const uint64_t F  = mdl->nftr;
	const uint32_t K  = mdl->opt->maxiter;
	const uint32_t C  = mdl->opt->objwin;
	const uint32_t M  = mdl->opt->lbfgs.histsz;
	const bool     l1 = mdl->opt->rho1 != 0.0;
	double *x, *xp; // Current and previous value of the variables
	double *g, *gp; // Current and previous value of the gradient
	double *pg;     // The pseudo-gradient (only for owl-qn)
	double *d;      // The search direction
	double *s[M];   // History value s_k = Δ(x,px)
	double *y[M];   // History value y_k = Δ(g,pg)
	double  p[M];   // ρ_k
	double  fh[C];  // f(x) history
	// Initialization: Here, we have to allocate memory on the heap as we
	// cannot request so much memory on the stack as this will have a too
	// big impact on performance and will be refused by the system on non-
	// trivial models.
	x  = mdl->theta;
	xp = xvm_new(F); g = xvm_new(F);
	gp = xvm_new(F); d = xvm_new(F);
	for (uint32_t m = 0; m < M; m++) {
		s[m] = xvm_new(F);
		y[m] = xvm_new(F);
	}
	pg = l1 ? xvm_new(F) : NULL;
	grd_t *grd = grd_new(mdl, g);
	// Restore a saved state if user specified one.
	if (mdl->opt->rstate != NULL) {
		const char *err = "invalid state file";
		FILE *file = fopen(mdl->opt->rstate, "r");
		if (file == NULL)
			fatal("failed to open input state file");
		int type, histsz;
		uint64_t nftr;
		if (fscanf(file, "#state#%d#%d#%"SCNu64"\n", &type, &histsz,
				&nftr) != 3)
			fatal("0 %s", err);
		if (type != 0 || histsz != (int)M)
			fatal("state is not compatible");
		for (uint64_t i = 0; i < nftr; i++) {
			uint64_t f;
			if (fscanf(file, "%"PRIu64, &f) != 1)
				fatal("1 %s", err);
			if (fscanf(file, "%la %la", &xp[f], &gp[f]) != 2)
				fatal("2 %s", err);
			for (uint32_t m = 0; m < M; m++) {
				if (fscanf(file, "%la", &s[m][f]) != 1)
					fatal("3 %s", err);
				if (fscanf(file, "%la", &y[m][f]) != 1)
					fatal("4 %s", err);
			}
		}
		for (uint32_t m = 0; m < M; m++)
			p[m] = 1.0 / xvm_dot(y[m], s[m], F);
		fclose(file);
	}
	// Minimization: This is the heart of the function. (a big heart...) We
	// will perform iterations until one these conditions is reached
	//   - the maximum iteration count is reached
	//   - we have converged (upto numerical precision)
	//   - the report function return false
	//   - an error happen somewhere
	double fx = grd_gradient(grd);
	for (uint32_t k = 0; !uit_stop && k < K; k++) {
		// We first compute the pseudo-gradient of f for owl-qn. It is
		// defined in [3, pp 335(4)]
		//              | ∂_i^- f(x)   if ∂_i^- f(x) > 0
		//   ◇_i f(x) = | ∂_i^+ f(x)   if ∂_i^+ f(x) < 0
		//              | 0            otherwise
		// with
		//   ∂_i^± f(x) = ∂/∂x_i l(x) + | Cσ(x_i) if x_i ≠ 0
		//                              | ±C      if x_i = 0
		if (l1) {
			const double rho1 = mdl->opt->rho1;
			for (uint64_t f = 0; f < F; f++) {
				if (x[f] < 0.0)
					pg[f] = g[f] - rho1;
				else if (x[f] > 0.0)
					pg[f] = g[f] + rho1;
				else if (g[f] < -rho1)
					pg[f] = g[f] + rho1;
				else if (g[f] > rho1)
					pg[f] = g[f] - rho1;
				else
					pg[f] = 0.0;
			}
		}
		// 1st step: We compute the search direction. We search in the
		// direction who minimize the second order approximation given
		// by the Taylor series which give
		//   d_k = - H_k^{-1} g_k
		// But computing the inverse of the hessian is intractable so
		// the l-bfgs only approximate it's diagonal. The exact
		// computation is well described in [1, pp 779].
		// The only special thing for owl-qn here is to use the pseudo
		// gradient instead of the true one.
		xvm_neg(d, l1 ? pg : g, F);
		if (k != 0) {
			const uint32_t km = k % M;
			const uint32_t bnd = (k <= M) ? k : M;
			double alpha[M], beta;
			// α_i = ρ_j s_j^T q_{i+1}
			// q_i = q_{i+1} - α_i y_i
			for (uint32_t i = bnd; i > 0; i--) {
				const uint32_t j = (M + 1 + k - i) % M;
				alpha[i - 1] = p[j] * xvm_dot(s[j], d, F);
				xvm_axpy(d, -alpha[i - 1], y[j], d, F);
			}
			// r_0 = H_0 q_0
			//     Scaling is described in [2, pp 515]
			//     for k = 0: H_0 = I
			//     for k > 0: H_0 = I * y_k^T s_k / ||y_k||²
			//                    = I * 1 / ρ_k ||y_k||²
			const double y2 = xvm_dot(y[km], y[km], F);
			const double v = 1.0 / (p[km] * y2);
			for (uint64_t f = 0; f < F; f++)
				d[f] *= v;
			// β_j     = ρ_j y_j^T r_i
			// r_{i+1} = r_i + s_j (α_i - β_i)
			for (uint32_t i = 0; i < bnd; i++) {
				const uint32_t j = (M + k - i) % M;
				beta = p[j] * xvm_dot(y[j], d, F);
				xvm_axpy(d, alpha[i] - beta, s[j], d, F);
			}
		}
		// For owl-qn, we must remain in the same orthant than the
		// pseudo-gradient, so we have to constrain the search
		// direction as described in [3, pp 35(3)]
		//   d^k = π(d^k ; v^k)
		//       = π(d^k ; -◇f(x^k))
		if (l1)
			for (uint64_t f = 0; f < F; f++)
				if (d[f] * pg[f] >= 0.0)
					d[f] = 0.0;
		// 2nd step: we perform a linesearch in the computed direction,
		// we search a step value that satisfy the constrains using a
		// backtracking algorithm. Much elaborated algorithm can perform
		// better in the general case, but for CRF training, bactracking
		// is very efficient and simple to implement.
		// For quasi-Newton, the natural step is 1.0 so we start with
		// this one and reduce it only if it fail with an exception for
		// the first step where a better guess can be done.
		// We have to keep track of the current point and gradient as we
		// will need to compute the delta between those and the found
		// point, and perhaps need to restore them if linesearch fail.
		memcpy(xp, x, sizeof(double) * F);
		memcpy(gp, g, sizeof(double) * F);
		double sc  = (k == 0) ? 0.1 : 0.5;
		double stp = (k == 0) ? 1.0 / xvm_norm(d, F) : 1.0;
		double gd  = l1 ? 0.0 : xvm_dot(g, d, F); // gd = g_k^T d_k
		double fi  = fx;
		bool err = false;
		for (uint32_t ls = 1; !uit_stop; ls++, stp *= sc) {
			// We compute the new point using the current step and
			// search direction
			xvm_axpy(x, stp, d, xp, F);
			// For owl-qn, we have to project back the point in the
			// current orthant [3, pp 35]
			//   x^{k+1} = π(x^k + αp^k ; ξ)
			if (l1) {
				for (uint64_t f = 0; f < F; f++) {
					double or = xp[f];
					if (or == 0.0)
						or = -pg[f];
					if (x[f] * or <= 0.0)
						x[f] = 0.0;
				}
			}
			// And we ask for the value of the objective function
			// and its gradient.
			fx = grd_gradient(grd);
			// Now we check if the step satisfy the conditions. For
			// l-bfgs, we check the classical decrease and curvature
			// known as the Wolfe conditions [2, pp 506]
			//   f(x_k + α_k d_k) ≤ f(x_k) + β' α_k g_k^T d_k
			//   g(x_k + α_k d_k)^T d_k ≥ β g_k^T d_k
			//
			// And for owl-qn we check a variant of the Armijo rule
			// described in [3, pp 36]
			//   f(π(x^k+αp^k;ξ)) ≤ f(x^k) - γv^T[π(x^k+αp^k;ξ)-x^k]
			if (!l1) {
				if (fx > fi + stp * gd * 1e-4)
					sc = 0.5;
				else if (xvm_dot(g, d, F) < gd * 0.9)
					sc = 2.1;
				else
					break;
			} else {
				double vp = 0.0;
				for (uint64_t f = 0; f < F; f++)
					vp += (x[f] - xp[f]) * d[f];
				if (fx < fi + vp * 1e-4)
					break;
			}
			// If we reach the maximum number of linesearsh steps
			// without finding a good one, we just fail.
			if (ls == mdl->opt->lbfgs.maxls) {
				warning("maximum linesearch reached");
				err = true;
				break;
			}
		}
		// If linesearch failed or user interupted training, we return
		// to the last valid point and stop the training. The model is
		// probably not fully optimized but we let the user decide what
		// to do with it.
		if (err || uit_stop) {
			memcpy(x, xp, sizeof(double) * F);
			break;
		}
		if (uit_progress(mdl, k + 1, fx) == false)
			break;
		// 3rd step: we update the history used for approximating the
		// inverse of the diagonal of the hessian
		//   s_k = x_{k+1} - x_k
		//   y_k = g_{k+1} - g_k
		//   ρ_k = 1 / y_k^T s_k
		const uint32_t kn = (k + 1) % M;
		xvm_sub(s[kn], x, xp, F);
		xvm_sub(y[kn], g, gp, F);
		p[kn] = 1.0 / xvm_dot(y[kn], s[kn], F);
		// And last, we check for convergence. The convergence check is
		// quite simple [2, pp 508]
		//   ||g|| / max(1, ||x||) ≤ ε
		// with ε small enough so we stop when numerical precision is
		// reached. For owl-qn we just have to check against the pseudo-
		// gradient instead of the true one.
		const double xn = xvm_norm(x, F);
		const double gn = xvm_norm(l1 ? pg : g, F);
		if (gn / max(xn, 1.0) <= 1e-5)
			break;
		if (k + 1 == K)
			break;
		// Second stoping criterion tested is a check for improvement of
		// the function value over the past W iteration. When this come
		// under an epsilon, we also stop the minimization.
		fh[k % C] = fx;
		double dlt = 1.0;
		if (k >= C) {
			const double of = fh[(k + 1) % C];
			dlt = fabs(of - fx) / of;
			if (dlt < mdl->opt->stopeps)
				break;
		}
	}
	// Save the optimizer state if requested by the user
	if (mdl->opt->sstate != NULL) {
		FILE *file = fopen(mdl->opt->sstate, "w");
		if (file == NULL)
			fatal("failed to open output state file");
		fprintf(file, "#state#0#%"PRIu32"#%"PRIu64"\n", M, F);
		for (uint64_t f = 0; f < F; f++) {
			fprintf(file, "%"PRIu64, f);
			fprintf(file, " %la %la", xp[f], gp[f]);
			for (uint32_t m = 0; m < M; m++)
				fprintf(file, " %la %la", s[m][f], y[m][f]);
			fprintf(file, "\n");
		}
		fclose(file);
	}
	// Cleanup: We free all the vectors we have allocated.
	xvm_free(xp); xvm_free(g);
	xvm_free(gp); xvm_free(d);
	for (uint32_t m = 0; m < M; m++) {
		xvm_free(s[m]);
		xvm_free(y[m]);
	}
	if (l1)
		xvm_free(pg);
	grd_free(grd);
}